

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.c
# Opt level: O0

unsigned_long elf_hash(char *_name)

{
  ulong uVar1;
  unsigned_long g;
  unsigned_long h;
  uchar *name;
  char *_name_local;
  
  h = 0;
  name = (uchar *)_name;
  while (*name != '\0') {
    h = h * 0x10 + (ulong)*name;
    uVar1 = h & 0xf0000000;
    if (uVar1 != 0) {
      h = uVar1 >> 0x18 ^ h;
    }
    h = (uVar1 ^ 0xffffffffffffffff) & h;
    name = name + 1;
  }
  return h;
}

Assistant:

unsigned long elf_hash(const char *_name)
/* calculate a hash code as used in ELF objects */
{
  const unsigned char *name=(const unsigned char *)_name;
  unsigned long h=0,g;

  while (*name) {
    h = (h << 4) + *name++;
    if (g = h & 0xf0000000)
      h ^= g >> 24;
    h &= ~g;
  }
  return h;
}